

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

re_state_id re_alloc_state(re_context *ctx)

{
  int iVar1;
  uchar *puVar2;
  size_t in_RDI;
  re_tuple *ptr;
  uint new_alloc;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x18) <= *(int *)(in_RDI + 8)) {
    iVar1 = *(int *)(in_RDI + 0x18) + 100;
    if (*(int *)(in_RDI + 0x18) == 0) {
      puVar2 = mchalo((errcxdef *)ptr,in_RDI,(char *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      *(uchar **)(in_RDI + 0x10) = puVar2;
    }
    else {
      puVar2 = mchalo((errcxdef *)ptr,in_RDI,(char *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      memcpy(puVar2,*(void **)(in_RDI + 0x10),(long)*(int *)(in_RDI + 0x18) << 5);
      free(*(void **)(in_RDI + 0x10));
      *(uchar **)(in_RDI + 0x10) = puVar2;
    }
    *(int *)(in_RDI + 0x18) = iVar1;
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 8) * 0x20 + 4) = 0xffffffff;
  *(undefined4 *)(*(long *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 8) * 0x20 + 8) = 0xffffffff;
  *(undefined1 *)(*(long *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 8) * 0x20) = 1;
  *(undefined1 *)(*(long *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 8) * 0x20 + 0x18) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 8) * 0x20 + 0x10) = 0;
  iVar1 = *(int *)(in_RDI + 8);
  *(int *)(in_RDI + 8) = iVar1 + 1;
  return iVar1;
}

Assistant:

static re_state_id re_alloc_state(re_context *ctx)
{
    /*
     *   If we don't have enough room for another state, expand the array 
     */
    if (ctx->next_state >= ctx->tuples_alloc)
    {
        uint new_alloc;
        
        /* bump the size by a bit */
        new_alloc = ctx->tuples_alloc + 100;
        
        /* allocate or expand the array */
        if (ctx->tuples_alloc == 0)
        {
            /* allocate the initial memory block */
            ctx->tuple_arr =
                (re_tuple *)mchalo(ctx->errctx,
                                   (new_alloc * sizeof(re_tuple)),
                                   "regex");
        }
        else
        {
            re_tuple *ptr;
            
            /* allocate a new memory block */
            ptr = (re_tuple *)mchalo(ctx->errctx,
                                     (new_alloc * sizeof(re_tuple)),
                                     "regex");
            
            /* copy the old memory to the new memory */
            memcpy(ptr, ctx->tuple_arr, ctx->tuples_alloc * sizeof(re_tuple));

            /* free the old block */
            mchfre(ctx->tuple_arr);

            /* use the new block */
            ctx->tuple_arr = ptr;
        }

        /* remember the new allocation size */
        ctx->tuples_alloc = new_alloc;
    }

    /* initialize the next state */
    ctx->tuple_arr[ctx->next_state].next_state_1 = RE_STATE_INVALID;
    ctx->tuple_arr[ctx->next_state].next_state_2 = RE_STATE_INVALID;
    ctx->tuple_arr[ctx->next_state].ch = RE_EPSILON;
    ctx->tuple_arr[ctx->next_state].flags = 0;
    ctx->tuple_arr[ctx->next_state].char_range = 0;

    /* return the new state's ID */
    return ctx->next_state++;
}